

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,false,false>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  sel_t sVar11;
  ulong uVar12;
  unsigned_long uVar13;
  ulong uVar14;
  ulong uVar15;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar7 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,false,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar7;
    }
    if (count + 0x3f < 0x40) {
      iVar7 = 0;
    }
    else {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar7 = 0;
      uVar12 = 0;
      uVar14 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar13 = 0xffffffffffffffff;
        }
        else {
          uVar13 = puVar1[uVar12];
        }
        uVar15 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar15 = count;
        }
        uVar8 = uVar15;
        if (uVar13 != 0) {
          uVar8 = uVar14;
          if (uVar13 == 0xffffffffffffffff) {
            if (uVar14 < uVar15) {
              psVar2 = sel->sel_vector;
              psVar3 = true_sel->sel_vector;
              uVar14 = uVar14 << 4 | 8;
              do {
                uVar9 = uVar8;
                if (psVar2 != (sel_t *)0x0) {
                  uVar9 = (ulong)psVar2[uVar8];
                }
                uVar10 = *(ulong *)((long)ldata + (uVar14 - 8));
                lVar4 = *(long *)((long)&ldata->lower + uVar14);
                lVar5 = *(long *)((long)&rdata->lower + uVar14);
                uVar6 = *(ulong *)((long)rdata + (uVar14 - 8));
                psVar3[iVar7] = (sel_t)uVar9;
                iVar7 = iVar7 + (uVar6 < uVar10 && lVar4 == lVar5 ||
                                lVar4 != lVar5 && lVar5 <= lVar4);
                uVar8 = uVar8 + 1;
                uVar14 = uVar14 + 0x10;
              } while (uVar15 != uVar8);
            }
          }
          else if (uVar14 < uVar15) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            uVar9 = uVar14 << 4 | 8;
            uVar8 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar11 = (int)uVar14 + (int)uVar8;
              }
              else {
                sVar11 = psVar2[uVar14 + uVar8];
              }
              if ((uVar13 >> (uVar8 & 0x3f) & 1) == 0) {
                uVar10 = 0;
              }
              else {
                lVar4 = *(long *)((long)&ldata->lower + uVar9);
                lVar5 = *(long *)((long)&rdata->lower + uVar9);
                uVar10 = (ulong)(*(ulong *)((long)rdata + (uVar9 - 8)) <
                                 *(ulong *)((long)ldata + (uVar9 - 8)) && lVar4 == lVar5 ||
                                lVar4 != lVar5 && lVar5 <= lVar4);
              }
              psVar3[iVar7] = sVar11;
              iVar7 = iVar7 + uVar10;
              uVar8 = uVar8 + 1;
              uVar9 = uVar9 + 0x10;
            } while ((uVar14 - uVar15) + uVar8 != 0);
            uVar8 = uVar14 + uVar8;
          }
        }
        uVar12 = uVar12 + 1;
        uVar14 = uVar8;
      } while (uVar12 != count + 0x3f >> 6);
    }
  }
  else {
    iVar7 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThan,false,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar7;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}